

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoleculeStamp.cpp
# Opt level: O2

bool __thiscall
OpenMD::MoleculeStamp::addConstraintStamp(MoleculeStamp *this,ConstraintStamp *constraint)

{
  ConstraintStamp *local_8;
  
  local_8 = constraint;
  std::vector<OpenMD::ConstraintStamp_*,_std::allocator<OpenMD::ConstraintStamp_*>_>::push_back
            (&this->constraintStamps_,&local_8);
  return true;
}

Assistant:

bool MoleculeStamp::addConstraintStamp(ConstraintStamp* constraint) {
    constraintStamps_.push_back(constraint);
    return true;
  }